

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

void event_active_nolock_(event *ev,int res,short ncalls)

{
  char *pcVar1;
  event_base *base;
  unsigned_long uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  unsigned_long uVar6;
  event_debug_entry *peVar7;
  event *lock_;
  ushort uVar8;
  
  if (event_debug_logging_mask_ != 0) {
    event_debugx_("event_active: %p (fd %d), res %d, callback %p",ev,(ulong)(uint)ev->ev_fd,
                  (ulong)(uint)res,(ev->ev_evcallback).evcb_cb_union.evcb_callback);
  }
  base = ev->ev_base;
  lock_ = (event *)base->th_base_lock;
  if (((lock_ != (event *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
     (iVar3 = evthread_is_debug_lock_held_(lock_), iVar3 == 0)) {
    event_active_nolock__cold_1();
switchD_001da433_caseD_5:
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0xb7c,"0","event_active_nolock_");
  }
  uVar8 = (ev->ev_evcallback).evcb_flags;
  if ((uVar8 & 0x40) != 0) {
    return;
  }
  uVar4 = uVar8 >> 3 & 5;
  pcVar5 = (char *)((long)&switchD_001da433::switchdataD_00230810 +
                   (long)(int)(&switchD_001da433::switchdataD_00230810)[uVar4]);
  uVar8 = (ushort)res;
  switch(uVar4) {
  case 0:
    ev->ev_res = uVar8;
    break;
  case 1:
    ev->ev_res = ev->ev_res | uVar8;
    return;
  default:
    if (event_debug_mode_on_ != 0) {
      if (event_debug_map_lock_ != (void *)0x0) {
        (*evthread_lock_fns_.lock)(0,event_debug_map_lock_);
      }
      if (global_debug_map.hth_table != (event_debug_entry **)0x0) {
        peVar7 = (event_debug_entry *)
                 (global_debug_map.hth_table +
                 ((ulong)lock_ >> 6 & 0x3ffffff) % (ulong)global_debug_map.hth_table_length);
        do {
          peVar7 = (peVar7->node).hte_next;
          if (peVar7 == (event_debug_entry *)0x0) goto LAB_001da56e;
        } while (peVar7->ptr != lock_);
        if ((peVar7->field_0x10 & 1) != 0) {
          event_errx(-0x21522153,
                     "%s called on an already added event %p (events: 0x%x, fd: %d, flags: 0x%x)",
                     "event_debug_assert_not_added_",lock_,(ulong)(uint)(int)lock_->ev_events,
                     (ulong)(uint)lock_->ev_fd,(int)(lock_->ev_evcallback).evcb_flags);
        }
      }
LAB_001da56e:
      if (event_debug_map_lock_ != (void *)0x0) {
        (*evthread_lock_fns_.unlock)(0,event_debug_map_lock_);
        return;
      }
    }
    return;
  case 4:
    ev->ev_res = ev->ev_res | uVar8;
    break;
  case 5:
    goto switchD_001da433_caseD_5;
  case 6:
    *pcVar5 = *pcVar5 + (char)pcVar5;
    pcVar1 = (char *)((long)&ev[-0xed6e01].ev_ + 0x10);
    *pcVar1 = *pcVar1 + (char)pcVar5;
    return;
  case 7:
    return;
  }
  if ((int)(uint)(ev->ev_evcallback).evcb_pri < base->event_running_priority) {
    base->event_continue = 1;
  }
  if ((ev->ev_events & 8) != 0) {
    if ((evthread_id_fn_ != (_func_unsigned_long *)0x0 && (event *)base->current_event == ev) &&
       (uVar2 = base->th_owner_id, uVar6 = (*evthread_id_fn_)(), uVar2 != uVar6)) {
      base->current_event_waiters = base->current_event_waiters + 1;
      if (base->current_event_cond != (void *)0x0) {
        (*evthread_cond_fns_.wait_condition)
                  (base->current_event_cond,base->th_base_lock,(timeval *)0x0);
      }
    }
    (ev->ev_).ev_signal.ev_ncalls = ncalls;
    (ev->ev_).ev_io.ev_timeout.tv_usec = 0;
  }
  event_callback_activate_nolock_(base,&ev->ev_evcallback);
  return;
}

Assistant:

void
event_active_nolock_(struct event *ev, int res, short ncalls)
{
	struct event_base *base;

	event_debug(("event_active: %p (fd "EV_SOCK_FMT"), res %d, callback %p",
		ev, EV_SOCK_ARG(ev->ev_fd), (int)res, ev->ev_callback));

	base = ev->ev_base;
	EVENT_BASE_ASSERT_LOCKED(base);

	if (ev->ev_flags & EVLIST_FINALIZING) {
		/* XXXX debug */
		return;
	}

	switch ((ev->ev_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER))) {
	default:
	case EVLIST_ACTIVE|EVLIST_ACTIVE_LATER:
		EVUTIL_ASSERT(0);
		break;
	case EVLIST_ACTIVE:
		/* We get different kinds of events, add them together */
		ev->ev_res |= res;
		return;
	case EVLIST_ACTIVE_LATER:
		ev->ev_res |= res;
		break;
	case 0:
		ev->ev_res = res;
		break;
	}

	if (ev->ev_pri < base->event_running_priority)
		base->event_continue = 1;

	if (ev->ev_events & EV_SIGNAL) {
#ifndef EVENT__DISABLE_THREAD_SUPPORT
		if (base->current_event == event_to_event_callback(ev) &&
		    !EVBASE_IN_THREAD(base)) {
			++base->current_event_waiters;
			EVTHREAD_COND_WAIT(base->current_event_cond, base->th_base_lock);
		}
#endif
		ev->ev_ncalls = ncalls;
		ev->ev_pncalls = NULL;
	}

	event_callback_activate_nolock_(base, event_to_event_callback(ev));
}